

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O3

Token * __thiscall GetOpt::GetOpt_pp::_add_token(GetOpt_pp *this,string *value,Type type)

{
  pointer pcVar1;
  Token *pTVar2;
  Token **ppTVar3;
  
  pTVar2 = (Token *)operator_new(0x30);
  pTVar2->type = type;
  (pTVar2->value)._M_dataplus._M_p = (pointer)&(pTVar2->value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar2->value,pcVar1,pcVar1 + value->_M_string_length);
  pTVar2->next = (Token *)0x0;
  ppTVar3 = &this->_last_token->next;
  if (this->_first_token == (Token *)0x0) {
    ppTVar3 = &this->_first_token;
  }
  *ppTVar3 = pTVar2;
  this->_last_token = pTVar2;
  return pTVar2;
}

Assistant:

GETOPT_INLINE Token* GetOpt_pp::_add_token(const std::string& value, Token::Type type)
{
    Token* const ret = new Token(value, type);
    if (_first_token == NULL)
        _first_token = ret;
    else
        _last_token->link_to(ret);
    _last_token = ret;
    return ret;
}